

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_positions.hpp
# Opt level: O1

void __thiscall
text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::cluster1
          (text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_> *this,
          uint i,uint j)

{
  pointer puVar1;
  byte bVar2;
  const_iterator cVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_> *ptVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  cpair ab;
  vector<bool,_std::allocator<bool>_> distinct_pair_positions;
  unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  H1;
  uint local_ac;
  key_type local_a8;
  text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_> *local_a0;
  uint local_98;
  allocator_type local_91;
  vector<bool,_std::allocator<bool>_> local_90;
  undefined1 local_68 [32];
  float local_48;
  undefined1 local_40 [16];
  
  local_68._0_8_ = local_40 + 8;
  local_68._8_8_ = 1;
  local_68._16_16_ = (undefined1  [16])0x0;
  local_48 = 1.0;
  local_40 = (undefined1  [16])0x0;
  local_a8 = (key_type)((ulong)local_a8 & 0xffffffffffffff00);
  local_a0 = this;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_90,(ulong)(j - i),(bool *)&local_a8,&local_91);
  if (i < j) {
    uVar7 = (ulong)i;
    uVar9 = 0;
    do {
      puVar1 = (local_a0->TP).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar8 = puVar1[uVar7 + uVar9];
      if (((local_a0->T->non_blank).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8 >> 6] >> ((ulong)(byte)~(byte)uVar8 & 0x3f) & 1)
          != 0) {
        local_a8 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                             (local_a0->T,puVar1[uVar7 + uVar9]);
        auVar14._8_8_ = 0;
        auVar14._0_4_ = local_a8.first;
        auVar14._4_4_ = local_a8.second;
        auVar19._8_8_ = 0;
        auVar19._0_4_ = (local_a0->nullpair).first;
        auVar19._4_4_ = (local_a0->nullpair).second;
        uVar5 = vpcmpd_avx512vl(auVar19,auVar14,4);
        if ((uVar5 & 3) != 0) {
          cVar3 = std::
                  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find((_Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)local_68,&local_a8);
          uVar5 = uVar9 >> 6;
          uVar11 = 1L << (uVar9 & 0x3f);
          if (cVar3.
              super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            uVar11 = uVar11 | local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar5]
            ;
          }
          else {
            uVar11 = ~uVar11 & local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                               [uVar5];
          }
          local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar5] = uVar11;
          cVar3 = std::
                  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find((_Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)local_68,&local_a8);
          if (cVar3.
              super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            pmVar4 = std::__detail::
                     _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)local_68,&local_a8);
            pmVar4->first = 0;
            pmVar4->second = 0;
          }
          pmVar4 = std::__detail::
                   _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)local_68,&local_a8);
          pmVar4->first = pmVar4->first + 1;
        }
      }
      uVar9 = uVar9 + 1;
    } while (j - uVar7 != uVar9);
  }
  ptVar12 = local_a0;
  local_ac = i;
  if (i < j) {
    uVar7 = 0;
    do {
      if ((local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0) {
        local_a8 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                             (ptVar12->T,
                              (ptVar12->TP).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[i + uVar7]);
        pmVar4 = std::__detail::
                 _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_68,&local_a8);
        uVar8 = pmVar4->first;
        pmVar4 = std::__detail::
                 _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_68,&local_a8);
        pmVar4->first = local_ac;
        pmVar4 = std::__detail::
                 _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_68,&local_a8);
        pmVar4->second = local_ac;
        local_ac = local_ac + uVar8;
        ptVar12 = local_a0;
      }
      uVar7 = uVar7 + 1;
    } while ((ulong)j - (ulong)i != uVar7);
  }
  if (i < j) {
    uVar7 = 0;
    do {
      bVar2 = (byte)uVar7 & 0x3f;
      local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p[uVar7 >> 6] =
           local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar7 >> 6] &
           (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
      uVar7 = uVar7 + 1;
    } while ((ulong)j - (ulong)i != uVar7);
  }
  if (i < j) {
    local_98 = local_ac;
    uVar8 = i;
    do {
      local_a8 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                           (ptVar12->T,
                            (ptVar12->TP).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar8]);
      auVar15._8_8_ = 0;
      auVar15._0_4_ = local_a8.first;
      auVar15._4_4_ = local_a8.second;
      auVar20._8_8_ = 0;
      auVar20._0_4_ = (ptVar12->nullpair).first;
      auVar20._4_4_ = (ptVar12->nullpair).second;
      uVar7 = vpcmpd_avx512vl(auVar20,auVar15,4);
      uVar10 = local_ac;
      uVar6 = local_98;
      if ((uVar7 & 3) != 0) {
        pmVar4 = std::__detail::
                 _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_68,&local_a8);
        uVar10 = pmVar4->first;
        pmVar4 = std::__detail::
                 _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_68,&local_a8);
        uVar6 = pmVar4->second;
      }
      ptVar12 = local_a0;
      if ((uVar8 < uVar10) || (uVar6 < uVar8)) {
        puVar1 = (local_a0->TP).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar10 = puVar1[uVar8];
        puVar1[uVar8] = puVar1[uVar6];
        puVar1[uVar6] = uVar10;
        auVar17._8_8_ = 0;
        auVar17._0_4_ = local_a8.first;
        auVar17._4_4_ = local_a8.second;
        auVar22._8_8_ = 0;
        auVar22._0_4_ = (local_a0->nullpair).first;
        auVar22._4_4_ = (local_a0->nullpair).second;
        uVar7 = vpcmpd_avx512vl(auVar17,auVar22,4);
        if ((uVar7 & 3) == 0) {
          local_98 = local_98 + 1;
        }
        else {
          pmVar4 = std::__detail::
                   _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)local_68,&local_a8);
          pmVar4->second = pmVar4->second + 1;
        }
      }
      else {
        if (uVar8 == uVar10) {
          auVar16._8_8_ = 0;
          auVar16._0_4_ = local_a8.first;
          auVar16._4_4_ = local_a8.second;
          auVar21._8_8_ = 0;
          auVar21._0_4_ = (local_a0->nullpair).first;
          auVar21._4_4_ = (local_a0->nullpair).second;
          uVar7 = vpcmpd_avx512vl(auVar16,auVar21,4);
          bVar13 = (uVar7 & 3) != 0;
        }
        else {
          bVar13 = false;
        }
        uVar7 = 1L << ((ulong)(uVar8 - i) & 0x3f);
        uVar10 = uVar8 - i >> 6;
        if (bVar13) {
          uVar7 = uVar7 | local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar10];
        }
        else {
          uVar7 = ~uVar7 & local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar10];
        }
        local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[uVar10] = uVar7;
        uVar8 = uVar8 + 1;
        auVar18._8_8_ = 0;
        auVar18._0_4_ = local_a8.first;
        auVar18._4_4_ = local_a8.second;
        auVar23._8_8_ = 0;
        auVar23._0_4_ = (local_a0->nullpair).first;
        auVar23._4_4_ = (local_a0->nullpair).second;
        uVar7 = vpcmpd_avx512vl(auVar18,auVar23,4);
        if ((uVar7 & 3) == 0) {
          local_98 = local_98 + (uVar6 == uVar8);
        }
        else {
          pmVar4 = std::__detail::
                   _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)local_68,&local_a8);
          pmVar4->second = pmVar4->second + (uint)(uVar6 == uVar8);
          ptVar12 = local_a0;
        }
      }
    } while (uVar8 < j);
  }
  if (local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_68);
  return;
}

Assistant:

void cluster1(itype i, itype j){

		unordered_map<cpair,ipair> H1;

		assert(i<size());
		assert(j<=size());
		assert(i<j);

		//mark in a bitvector only one position per distinct pair
		auto distinct_pair_positions = vector<bool>(j-i,false);

		//first step: count frequencies
		for(itype k = i; k<j; ++k){

			if(not T->is_blank(TP[k])){

				cpair ab = T->pair_starting_at(TP[k]);

				if(ab != nullpair ){

					//write a '1' iff this is the first time we see this pair
					distinct_pair_positions[k-i] = (H1.count(ab)==0);

					if(H1.count(ab)==0) H1[ab] = {0,0};

					H1[ab].first++;

				}

			}

		}

		itype t = i;//cumulated freq

		//second step: cumulate frequencies
		for(itype k = i; k<j; ++k){

			if(distinct_pair_positions[k-i]){

				cpair ab = T->pair_starting_at(TP[k]);

				assert(ab != nullpair);

				itype temp = H1[ab].first;

				H1[ab].first = t;
				H1[ab].second = t;

				t += temp;

			}

		}

		//clear bitvector content
		for(itype k = i; k<j;++k) distinct_pair_positions[k-i] = false;

		//t is the starting position of null pairs

		itype null_start = t;

		//third step: cluster
		itype k = i; //current position in TP

		//invariant: TP[i,...,k] is clustered
		while(k<j){

			cpair ab = T->pair_starting_at(TP[k]);

			itype ab_start;
			itype ab_end;

			if(ab==nullpair){

				ab_start = null_start;
				ab_end = t;

			}else{

				ab_start = H1[ab].first;
				ab_end = H1[ab].second;

			}

			if(k >= ab_start and k <= ab_end){

				//if k is the first position where a distinct pair (other than nullpair)
				//is seen in the sorted vector, mark it on distinct_pair_positions
				distinct_pair_positions[k-i] = (k==ab_start and ab!=nullpair);

				//dist_pairs += distinct_pair_positions[k-i];

				//case 1: ab is the right place: increment k
				k++;

				if(ab==nullpair){

					t += (ab_end == k);

				}else{

					//if k is exactly next ab position, increment next ab position
					H1[ab].second += (ab_end == k);

				}

			}else{

				//ab has to go to ab_end. swap TP[k] and TP[ab_end]
				itype temp = TP[k];
				TP[k] = TP[ab_end];
				TP[ab_end] = temp;

				if(ab==nullpair){

					t++;

				}else{

					//move forward ab_end since we inserted an ab on top of the list of ab's
					H1[ab].second++;

				}

			}

		}

		assert(is_clustered(i,j));

	}